

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Seek(DBIter *this,Slice *target)

{
  long lVar1;
  ulong uVar2;
  string *in_RSI;
  ParsedInternalKey *in_RDI;
  long in_FS_OFFSET;
  DBIter *in_stack_ffffffffffffff98;
  string *s;
  ParsedInternalKey *in_stack_ffffffffffffffa8;
  Slice *this_00;
  ParsedInternalKey *pPVar3;
  undefined1 skipping;
  DBIter *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&in_RDI[4].sequence = 0;
  pPVar3 = in_RDI;
  ClearSavedValue(in_stack_ffffffffffffff98);
  skipping = (undefined1)((ulong)pPVar3 >> 0x38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff98);
  s = (string *)&in_RDI[2].sequence;
  ParsedInternalKey::ParsedInternalKey
            (in_stack_ffffffffffffffa8,(Slice *)s,(SequenceNumber *)in_stack_ffffffffffffff98,
             kTypeDeletion);
  AppendInternalKey(in_RSI,in_RDI);
  this_00 = *(Slice **)&in_RDI[1].type;
  Slice::Slice(this_00,s);
  (**(code **)(this_00->data_ + 0x28))(this_00,&stack0xffffffffffffffc8);
  uVar2 = (**(code **)(**(long **)&in_RDI[1].type + 0x10))();
  if ((uVar2 & 1) == 0) {
    *(undefined1 *)((long)&in_RDI[4].sequence + 4) = 0;
  }
  else {
    FindNextUserEntry(in_stack_ffffffffffffffc8,(bool)skipping,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::Seek(const Slice& target) {
  direction_ = kForward;
  ClearSavedValue();
  saved_key_.clear();
  AppendInternalKey(&saved_key_,
                    ParsedInternalKey(target, sequence_, kValueTypeForSeek));
  iter_->Seek(saved_key_);
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}